

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinExponent
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  allocator_type *in_RCX;
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  Value VVar1;
  int exp;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  local_60;
  string local_48;
  Type local_24;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"exponent","");
  local_24 = NUMBER;
  __l._M_len = 1;
  __l._M_array = &local_24;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector(&local_60,__l,in_RCX);
  validateBuiltinArgs(this,loc,&local_48,args,&local_60);
  if (local_60.
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  frexp((((args->
          super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          )._M_impl.super__Vector_impl_data._M_start)->v).d,(int *)&local_48);
  VVar1 = makeNumberCheck(this,loc,(double)(int)local_48._M_dataplus._M_p);
  (this->scratch).t = NUMBER;
  (this->scratch).v = VVar1._0_8_;
  return (AST *)0x0;
}

Assistant:

const AST *builtinExponent(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "exponent", args, {Value::NUMBER});
        int exp;
        std::frexp(args[0].v.d, &exp);
        scratch = makeNumberCheck(loc, exp);
        return nullptr;
    }